

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

string * __thiscall
cmGeneratorTarget::GetOutputName
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config,
          ArtifactType artifact)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer pbVar3;
  _Rb_tree_iterator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmStateEnums::ArtifactType>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Var4;
  cmake *this_00;
  string *__rhs;
  long *plVar5;
  char *__s;
  size_t sVar6;
  cmValue cVar7;
  size_type *psVar8;
  _Alloc_hider _Var9;
  pointer prop;
  pair<std::_Rb_tree_iterator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmStateEnums::ArtifactType>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>
  pVar10;
  string outName;
  string type;
  string configUpper;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  props;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  OutputNameKey key;
  value_type entry;
  string local_70;
  string local_50;
  
  key.first._M_dataplus._M_p = (pointer)&key.first.field_2;
  pcVar2 = (config->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)&key,pcVar2,pcVar2 + config->_M_string_length)
  ;
  key.second = artifact;
  _Var4._M_node =
       (_Base_ptr)
       std::
       _Rb_tree<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmStateEnums::ArtifactType>,_std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmStateEnums::ArtifactType>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmStateEnums::ArtifactType>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmStateEnums::ArtifactType>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmStateEnums::ArtifactType>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&(this->OutputNameMap)._M_t,&key);
  if ((_Rb_tree_header *)_Var4._M_node == &(this->OutputNameMap)._M_t._M_impl.super__Rb_tree_header)
  {
    std::
    pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmStateEnums::ArtifactType>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmStateEnums::ArtifactType>_&,_const_char_(&)[1],_true>
              (&entry,&key,(char (*) [1])0x6f6625);
    pVar10 = std::
             _Rb_tree<std::pair<std::__cxx11::string,cmStateEnums::ArtifactType>,std::pair<std::pair<std::__cxx11::string,cmStateEnums::ArtifactType>const,std::__cxx11::string>,std::_Select1st<std::pair<std::pair<std::__cxx11::string,cmStateEnums::ArtifactType>const,std::__cxx11::string>>,std::less<std::pair<std::__cxx11::string,cmStateEnums::ArtifactType>>,std::allocator<std::pair<std::pair<std::__cxx11::string,cmStateEnums::ArtifactType>const,std::__cxx11::string>>>
             ::
             _M_emplace_unique<std::pair<std::pair<std::__cxx11::string,cmStateEnums::ArtifactType>const,std::__cxx11::string>&>
                       ((_Rb_tree<std::pair<std::__cxx11::string,cmStateEnums::ArtifactType>,std::pair<std::pair<std::__cxx11::string,cmStateEnums::ArtifactType>const,std::__cxx11::string>,std::_Select1st<std::pair<std::pair<std::__cxx11::string,cmStateEnums::ArtifactType>const,std::__cxx11::string>>,std::less<std::pair<std::__cxx11::string,cmStateEnums::ArtifactType>>,std::allocator<std::pair<std::pair<std::__cxx11::string,cmStateEnums::ArtifactType>const,std::__cxx11::string>>>
                         *)&this->OutputNameMap,&entry);
    _Var4 = pVar10.first._M_node;
    props.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    props.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    props.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __s = GetOutputTargetType(this,artifact);
    type._M_dataplus._M_p = (pointer)&type.field_2;
    sVar6 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)&type,__s,__s + sVar6);
    cmsys::SystemTools::UpperCase(&configUpper,config);
    if ((type._M_string_length != 0) && (configUpper._M_string_length != 0)) {
      __str._M_dataplus._M_p = (pointer)&__str.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__str,type._M_dataplus._M_p,
                 type._M_dataplus._M_p + type._M_string_length);
      std::__cxx11::string::append((char *)&__str);
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&__str,(ulong)configUpper._M_dataplus._M_p);
      psVar8 = (size_type *)(plVar5 + 2);
      if ((size_type *)*plVar5 == psVar8) {
        outName.field_2._M_allocated_capacity = *psVar8;
        outName.field_2._8_8_ = plVar5[3];
        outName._M_dataplus._M_p = (pointer)&outName.field_2;
      }
      else {
        outName.field_2._M_allocated_capacity = *psVar8;
        outName._M_dataplus._M_p = (pointer)*plVar5;
      }
      outName._M_string_length = plVar5[1];
      *plVar5 = (long)psVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&props,
                 &outName);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)outName._M_dataplus._M_p != &outName.field_2) {
        operator_delete(outName._M_dataplus._M_p,outName.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str._M_dataplus._M_p != &__str.field_2) {
        operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
      }
    }
    if (type._M_string_length != 0) {
      outName._M_dataplus._M_p = (pointer)&outName.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&outName,type._M_dataplus._M_p,
                 type._M_dataplus._M_p + type._M_string_length);
      std::__cxx11::string::append((char *)&outName);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&props,
                 &outName);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)outName._M_dataplus._M_p != &outName.field_2) {
        operator_delete(outName._M_dataplus._M_p,outName.field_2._M_allocated_capacity + 1);
      }
    }
    if (configUpper._M_string_length != 0) {
      std::operator+(&outName,"OUTPUT_NAME_",&configUpper);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&props,
                 &outName);
      paVar1 = &outName.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)outName._M_dataplus._M_p != paVar1) {
        operator_delete(outName._M_dataplus._M_p,outName.field_2._M_allocated_capacity + 1);
      }
      outName._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&outName,configUpper._M_dataplus._M_p,
                 configUpper._M_dataplus._M_p + configUpper._M_string_length);
      std::__cxx11::string::append((char *)&outName);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&props,
                 &outName);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)outName._M_dataplus._M_p != paVar1) {
        operator_delete(outName._M_dataplus._M_p,outName.field_2._M_allocated_capacity + 1);
      }
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[12]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&props,
               (char (*) [12])0x6b75ab);
    pbVar3 = props.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    outName._M_dataplus._M_p = (pointer)&outName.field_2;
    outName._M_string_length = 0;
    outName.field_2._M_allocated_capacity =
         outName.field_2._M_allocated_capacity & 0xffffffffffffff00;
    for (prop = props.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; prop != pbVar3; prop = prop + 1) {
      cVar7 = GetProperty(this,prop);
      if (cVar7.Value != (string *)0x0) {
        std::__cxx11::string::_M_assign((string *)&outName);
        break;
      }
    }
    if (outName._M_string_length == 0) {
      cmTarget::GetName_abi_cxx11_(this->Target);
      std::__cxx11::string::_M_assign((string *)&outName);
    }
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,outName._M_dataplus._M_p,
               outName._M_dataplus._M_p + outName._M_string_length);
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    cmGeneratorExpression::Evaluate
              (&__str,&local_70,this->LocalGenerator,config,(cmGeneratorTarget *)0x0,
               (cmGeneratorExpressionDAGChecker *)0x0,(cmGeneratorTarget *)0x0,&local_50);
    std::__cxx11::string::operator=((string *)&_Var4._M_node[2]._M_parent,(string *)&__str);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str._M_dataplus._M_p != &__str.field_2) {
      operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,
                      CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                               local_50.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,(ulong)(local_70.field_2._M_allocated_capacity + 1))
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)outName._M_dataplus._M_p != &outName.field_2) {
      operator_delete(outName._M_dataplus._M_p,outName.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)configUpper._M_dataplus._M_p != &configUpper.field_2) {
      operator_delete(configUpper._M_dataplus._M_p,configUpper.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)type._M_dataplus._M_p != &type.field_2) {
      operator_delete(type._M_dataplus._M_p,type.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&props);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)entry.second._M_dataplus._M_p != &entry.second.field_2) {
      operator_delete(entry.second._M_dataplus._M_p,entry.second.field_2._M_allocated_capacity + 1);
    }
    type.field_2._M_allocated_capacity = entry.first.first.field_2._M_allocated_capacity;
    _Var9._M_p = entry.first.first._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)entry.first.first._M_dataplus._M_p == &entry.first.first.field_2) goto LAB_00345142;
  }
  else {
    if (_Var4._M_node[2]._M_left != (_Base_ptr)0x0) goto LAB_00345142;
    this_00 = cmLocalGenerator::GetCMakeInstance(this->LocalGenerator);
    __rhs = cmTarget::GetName_abi_cxx11_(this->Target);
    std::operator+(&type,"Target \'",__rhs);
    plVar5 = (long *)std::__cxx11::string::append((char *)&type);
    paVar1 = &entry.first.first.field_2;
    psVar8 = (size_type *)(plVar5 + 2);
    if ((size_type *)*plVar5 == psVar8) {
      entry.first.first.field_2._M_allocated_capacity = *psVar8;
      entry.first.first.field_2._8_8_ = plVar5[3];
      entry.first.first._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      entry.first.first.field_2._M_allocated_capacity = *psVar8;
      entry.first.first._M_dataplus._M_p = (pointer)*plVar5;
    }
    entry.first.first._M_string_length = plVar5[1];
    *plVar5 = (long)psVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    GetBacktrace((cmGeneratorTarget *)&configUpper);
    cmake::IssueMessage(this_00,FATAL_ERROR,(string *)&entry,(cmListFileBacktrace *)&configUpper);
    if (configUpper._M_string_length != 0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)configUpper._M_string_length);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)entry.first.first._M_dataplus._M_p != paVar1) {
      operator_delete(entry.first.first._M_dataplus._M_p,
                      entry.first.first.field_2._M_allocated_capacity + 1);
    }
    _Var9._M_p = type._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)type._M_dataplus._M_p == &type.field_2) goto LAB_00345142;
  }
  operator_delete(_Var9._M_p,type.field_2._M_allocated_capacity + 1);
LAB_00345142:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,_Var4._M_node[2]._M_parent,
             (long)&(_Var4._M_node[2]._M_parent)->_M_color +
             (long)&(_Var4._M_node[2]._M_left)->_M_color);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)key.first._M_dataplus._M_p != &key.first.field_2) {
    operator_delete(key.first._M_dataplus._M_p,key.first.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetOutputName(
  const std::string& config, cmStateEnums::ArtifactType artifact) const
{
  // Lookup/compute/cache the output name for this configuration.
  OutputNameKey key(config, artifact);
  auto i = this->OutputNameMap.find(key);
  if (i == this->OutputNameMap.end()) {
    // Add empty name in map to detect potential recursion.
    OutputNameMapType::value_type entry(key, "");
    i = this->OutputNameMap.insert(entry).first;

    // Compute output name.
    std::vector<std::string> props;
    std::string type = this->GetOutputTargetType(artifact);
    std::string configUpper = cmSystemTools::UpperCase(config);
    if (!type.empty() && !configUpper.empty()) {
      // <ARCHIVE|LIBRARY|RUNTIME>_OUTPUT_NAME_<CONFIG>
      props.push_back(type + "_OUTPUT_NAME_" + configUpper);
    }
    if (!type.empty()) {
      // <ARCHIVE|LIBRARY|RUNTIME>_OUTPUT_NAME
      props.push_back(type + "_OUTPUT_NAME");
    }
    if (!configUpper.empty()) {
      // OUTPUT_NAME_<CONFIG>
      props.push_back("OUTPUT_NAME_" + configUpper);
      // <CONFIG>_OUTPUT_NAME
      props.push_back(configUpper + "_OUTPUT_NAME");
    }
    // OUTPUT_NAME
    props.emplace_back("OUTPUT_NAME");

    std::string outName;
    for (std::string const& p : props) {
      if (cmValue outNameProp = this->GetProperty(p)) {
        outName = *outNameProp;
        break;
      }
    }

    if (outName.empty()) {
      outName = this->GetName();
    }

    // Now evaluate genex and update the previously-prepared map entry.
    i->second =
      cmGeneratorExpression::Evaluate(outName, this->LocalGenerator, config);
  } else if (i->second.empty()) {
    // An empty map entry indicates we have been called recursively
    // from the above block.
    this->LocalGenerator->GetCMakeInstance()->IssueMessage(
      MessageType::FATAL_ERROR,
      "Target '" + this->GetName() + "' OUTPUT_NAME depends on itself.",
      this->GetBacktrace());
  }
  return i->second;
}